

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

int __thiscall ON_Layer::UpdateViewportIds(ON_Layer *this,ON_UuidPairList *viewport_id_map)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON__LayerPerViewSettings *a;
  ON__LayerPerViewSettings *s;
  int i;
  ON_UUID new_id;
  int rc;
  ON__LayerExtensions *ud;
  ON_UuidPairList *viewport_id_map_local;
  ON_Layer *this_local;
  
  iVar2 = ON_UuidPairList::Count(viewport_id_map);
  if (iVar2 < 1) {
    this_local._4_4_ = 0;
  }
  else {
    register0x00000000 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    if (register0x00000000 == (ON__LayerExtensions *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      new_id.Data4[0] = '\0';
      new_id.Data4[1] = '\0';
      new_id.Data4[2] = '\0';
      new_id.Data4[3] = '\0';
      for (s._0_4_ = 0; iVar2 = (int)s,
          iVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::Count
                            (&stack0xffffffffffffffd8->m_vp_settings), iVar2 < iVar3;
          s._0_4_ = (int)s + 1) {
        a = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                      (&stack0xffffffffffffffd8->m_vp_settings,(int)s);
        bVar1 = ON_UuidPairList::FindId1(viewport_id_map,a->m_viewport_id,(ON_UUID *)((long)&s + 4))
        ;
        if ((bVar1) &&
           (bVar1 = ::operator!=(&a->m_viewport_id,(ON_UUID_struct *)((long)&s + 4)), bVar1)) {
          (a->m_viewport_id).Data1 = s._4_4_;
          (a->m_viewport_id).Data2 = (undefined2)i;
          (a->m_viewport_id).Data3 = i._2_2_;
          *(undefined8 *)(a->m_viewport_id).Data4 = new_id._0_8_;
          new_id.Data4._0_4_ = new_id.Data4._0_4_ + 1;
        }
      }
      this_local._4_1_ = new_id.Data4[0];
      this_local._5_1_ = new_id.Data4[1];
      this_local._6_1_ = new_id.Data4[2];
      this_local._7_1_ = new_id.Data4[3];
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_Layer::UpdateViewportIds( const ON_UuidPairList& viewport_id_map )
{
  if ( viewport_id_map.Count() <= 0 )
    return 0;
  ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 == ud )
    return 0;
  int rc = 0;
  ON_UUID new_id;
  for ( int i = 0; i < ud->m_vp_settings.Count(); i++ )
  {
    ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
    if ( viewport_id_map.FindId1(s.m_viewport_id,&new_id) && s.m_viewport_id != new_id )
    {
      s.m_viewport_id = new_id;
      rc++;
    }
  }
  return rc;
}